

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

shared_ptr<duckdb::ParquetFileMetadataCache,_true> __thiscall
duckdb::LoadMetadata
          (duckdb *this,ClientContext *context,Allocator *allocator,CachingFileHandle *file_handle,
          shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *encryption_config,
          EncryptionUtil *encryption_util,optional_idx footer_size)

{
  ulong file_size;
  data_ptr_t pdVar1;
  unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
  this_00;
  long lVar2;
  pointer pTVar3;
  idx_t iVar4;
  ReadHead *pRVar5;
  InvalidInputException *pIVar6;
  pointer pFVar7;
  type pFVar8;
  type iprot;
  ParquetEncryptionConfig *this_01;
  string *key;
  pointer pFVar9;
  size_t __nbytes;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  idx_t pos;
  uint32_t uVar11;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> sVar12;
  bool footer_encrypted;
  allocator local_111;
  uint32_t read_footer_len;
  undefined4 uStack_10c;
  CachingFileHandle *local_108;
  _Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false> local_100;
  unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
  geo_metadata;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  AllocatedData local_e8 [32];
  shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *local_c8;
  optional_ptr<duckdb::ReadHead,_true> read_head;
  time_t current_time;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c8 = encryption_config;
  lVar2 = std::chrono::_V2::system_clock::now();
  __nbytes = 1000000000;
  current_time = lVar2 / 1000000000;
  local_108 = file_handle;
  CreateThriftFileProtocol((CachingFileHandle *)&local_100,SUB81(file_handle,0));
  pTVar3 = unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
           ::operator->((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                         *)&local_100);
  std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                *)&geo_metadata,
               &(pTVar3->ptrans_).
                super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
              );
  this_00 = geo_metadata;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
  file_size = *(ulong *)((long)this_00.
                               super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                               .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>.
                               _M_head_impl + 0x18);
  if (file_size < 0xc) {
    pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&geo_metadata,"File \'%s\' too small to be a Parquet file",
               (allocator *)&read_head);
    duckdb::CachingFileHandle::GetPath_abi_cxx11_();
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar6,(string *)&geo_metadata,&local_50);
    __cxa_throw(pIVar6,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (footer_size.index == 0xffffffffffffffff) {
    ResizeableBuffer::ResizeableBuffer((ResizeableBuffer *)&geo_metadata);
    ResizeableBuffer::resize((ResizeableBuffer *)&geo_metadata,allocator,8);
    memset((void *)geo_metadata.
                   super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                   .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl,0,
           (size_t)local_f0._M_pi);
    ThriftFileTransport::Prefetch
              ((ThriftFileTransport *)
               this_00.
               super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl,
               file_size - 8,8);
    *(ulong *)((long)this_00.
                     super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl +
              0x10) = file_size - 8;
    ThriftFileTransport::read
              ((ThriftFileTransport *)
               this_00.
               super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl,
               (int)geo_metadata.
                    super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                    .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl,
               (void *)0x8,__nbytes);
    duckdb::CachingFileHandle::GetPath_abi_cxx11_();
    ParseParquetFooter((data_ptr_t)
                       geo_metadata.
                       super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                       .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl,
                       (string *)&read_head,file_size,local_c8,&read_footer_len,&footer_encrypted);
    std::__cxx11::string::~string((string *)&read_head);
    iVar4 = file_size - (read_footer_len + 8);
    *(idx_t *)((long)this_00.
                     super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl +
              0x10) = iVar4;
    ThriftFileTransport::Prefetch
              ((ThriftFileTransport *)
               this_00.
               super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl,iVar4,
               (ulong)read_footer_len);
    duckdb::AllocatedData::~AllocatedData(local_e8);
  }
  else {
    iVar4 = optional_idx::GetIndex(&footer_size);
    uVar11 = (uint32_t)iVar4;
    if ((uVar11 == 0) || (file_size < uVar11 + 0xc)) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&geo_metadata,"Invalid footer length provided for file \'%s\'",
                 (allocator *)&read_head);
      duckdb::CachingFileHandle::GetPath_abi_cxx11_();
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar6,(string *)&geo_metadata,&local_70);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    pos = file_size - (uVar11 + 8);
    *(idx_t *)((long)this_00.
                     super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl +
              0x10) = pos;
    ThriftFileTransport::Prefetch
              ((ThriftFileTransport *)
               this_00.
               super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl,pos,
               (ulong)(uVar11 + 8));
    read_head.ptr =
         ReadAheadBuffer::GetReadHead
                   ((ReadAheadBuffer *)
                    ((long)this_00.
                           super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                           .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>.
                           _M_head_impl + 0x20),pos);
    pRVar5 = optional_ptr<duckdb::ReadHead,_true>::operator->(&read_head);
    pdVar1 = pRVar5->buffer_ptr;
    duckdb::CachingFileHandle::GetPath_abi_cxx11_();
    ParseParquetFooter(pdVar1 + (iVar4 & 0xffffffff),(string *)&geo_metadata,file_size,local_c8,
                       &read_footer_len,&footer_encrypted);
    std::__cxx11::string::~string((string *)&geo_metadata);
    if (read_footer_len != uVar11) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&geo_metadata,
                 "Parquet footer length stored in file is not equal to footer length provided",
                 &local_111);
      duckdb::InvalidInputException::InvalidInputException(pIVar6,(string *)&geo_metadata);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  make_uniq<duckdb_parquet::FileMetaData>();
  if (footer_encrypted == true) {
    make_uniq<duckdb_parquet::FileCryptoMetaData>();
    pFVar7 = unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
             ::operator->((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                           *)&read_footer_len);
    (**(code **)(*(long *)pFVar7 + 0x10))(pFVar7,local_100._M_head_impl);
    pFVar7 = unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
             ::operator->((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                           *)&read_footer_len);
    if (((byte)(pFVar7->encryption_algorithm).__isset & 2) != 0) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&geo_metadata,
                 "File \'%s\' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
                 &local_111);
      duckdb::CachingFileHandle::GetPath_abi_cxx11_();
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar6,(string *)&geo_metadata,&local_90);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    pFVar8 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
             ::operator*((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                          *)&read_head);
    lVar2 = *(long *)(*(long *)pFVar8 + -0x30);
    iprot = unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
            ::operator*((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                         *)&local_100);
    this_01 = shared_ptr<const_duckdb::ParquetEncryptionConfig,_true>::operator->(local_c8);
    key = ParquetEncryptionConfig::GetFooterKey_abi_cxx11_(this_01);
    ParquetCrypto::Read((TBase *)(&pFVar8->field_0x0 + lVar2),iprot,key,encryption_util);
    if ((long *)CONCAT44(uStack_10c,read_footer_len) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_10c,read_footer_len) + 8))();
    }
  }
  else {
    pFVar9 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
             ::operator->((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                           *)&read_head);
    (**(code **)(*(long *)pFVar9 + 0x10))(pFVar9,local_100._M_head_impl);
  }
  pFVar8 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
           ::operator*((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                        *)&read_head);
  GeoParquetFileMetadata::TryRead((GeoParquetFileMetadata *)&geo_metadata,pFVar8,context);
  make_shared_ptr<duckdb::ParquetFileMetadataCache,duckdb::unique_ptr<duckdb_parquet::FileMetaData,std::default_delete<duckdb_parquet::FileMetaData>,true>,long&,duckdb::unique_ptr<duckdb::GeoParquetFileMetadata,std::default_delete<duckdb::GeoParquetFileMetadata>,true>>
            ((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
              *)this,(long *)&read_head,
             (unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
              *)&current_time);
  std::
  unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>::
  ~unique_ptr(&geo_metadata.
               super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
             );
  _Var10._M_pi = extraout_RDX;
  if (read_head.ptr != (ReadHead *)0x0) {
    (**(code **)((read_head.ptr)->location + 8))();
    _Var10._M_pi = extraout_RDX_00;
  }
  if (local_100._M_head_impl != (TProtocol *)0x0) {
    (*(local_100._M_head_impl)->_vptr_TProtocol[1])();
    _Var10._M_pi = extraout_RDX_01;
  }
  sVar12.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var10._M_pi;
  sVar12.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<duckdb::ParquetFileMetadataCache,_true>)
         sVar12.internal.
         super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static shared_ptr<ParquetFileMetadataCache>
LoadMetadata(ClientContext &context, Allocator &allocator, CachingFileHandle &file_handle,
             const shared_ptr<const ParquetEncryptionConfig> &encryption_config, const EncryptionUtil &encryption_util,
             optional_idx footer_size) {
	auto current_time = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());

	auto file_proto = CreateThriftFileProtocol(file_handle, false);
	auto &transport = reinterpret_cast<ThriftFileTransport &>(*file_proto->getTransport());
	auto file_size = transport.GetSize();
	if (file_size < 12) {
		throw InvalidInputException("File '%s' too small to be a Parquet file", file_handle.GetPath());
	}

	bool footer_encrypted;
	// footer size is not provided - read it from the back
	if (!footer_size.IsValid()) {
		ResizeableBuffer buf;
		buf.resize(allocator, 8);
		buf.zero();

		transport.Prefetch(file_size - 8, 8);
		transport.SetLocation(file_size - 8);
		transport.read(buf.ptr, 8);

		uint32_t footer_len;
		ParseParquetFooter(buf.ptr, file_handle.GetPath(), file_size, encryption_config, footer_len, footer_encrypted);

		auto metadata_pos = file_size - (footer_len + 8);
		transport.SetLocation(metadata_pos);
		transport.Prefetch(metadata_pos, footer_len);
	} else {
		auto footer_len = UnsafeNumericCast<uint32_t>(footer_size.GetIndex());
		if (footer_len == 0 || file_size < 12 + footer_len) {
			throw InvalidInputException("Invalid footer length provided for file '%s'", file_handle.GetPath());
		}

		idx_t total_footer_len = footer_len + 8;
		auto metadata_pos = file_size - total_footer_len;
		transport.SetLocation(metadata_pos);
		transport.Prefetch(metadata_pos, total_footer_len);

		auto read_head = transport.GetReadHead(metadata_pos);
		auto data_ptr = read_head->buffer_ptr;

		uint32_t read_footer_len;
		ParseParquetFooter(data_ptr + footer_len, file_handle.GetPath(), file_size, encryption_config, read_footer_len,
		                   footer_encrypted);
		if (read_footer_len != footer_len) {
			throw InvalidInputException("Parquet footer length stored in file is not equal to footer length provided");
		}
	}

	auto metadata = make_uniq<FileMetaData>();
	if (footer_encrypted) {
		auto crypto_metadata = make_uniq<FileCryptoMetaData>();
		crypto_metadata->read(file_proto.get());
		if (crypto_metadata->encryption_algorithm.__isset.AES_GCM_CTR_V1) {
			throw InvalidInputException("File '%s' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
			                            file_handle.GetPath());
		}
		ParquetCrypto::Read(*metadata, *file_proto, encryption_config->GetFooterKey(), encryption_util);
	} else {
		metadata->read(file_proto.get());
	}

	// Try to read the GeoParquet metadata (if present)
	auto geo_metadata = GeoParquetFileMetadata::TryRead(*metadata, context);

	return make_shared_ptr<ParquetFileMetadataCache>(std::move(metadata), current_time, std::move(geo_metadata));
}